

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Section::~Section(Section *this)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  IResultCapture *pIVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  SectionEndInfo endInfo;
  long *local_88 [2];
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  char *local_48;
  size_t sStack_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  double local_20;
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__Section_001b3f28;
  if (this->m_sectionIncluded == true) {
    pcVar1 = (this->m_info).name._M_dataplus._M_p;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,pcVar1,pcVar1 + (this->m_info).name._M_string_length);
    pcVar1 = (this->m_info).description._M_dataplus._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + (this->m_info).description._M_string_length);
    local_48 = (this->m_info).lineInfo.file;
    sStack_40 = (this->m_info).lineInfo.line;
    local_38 = (this->m_assertions).passed;
    sStack_30 = (this->m_assertions).failed;
    local_28 = (this->m_assertions).failedButOk;
    lVar3 = std::chrono::_V2::system_clock::now();
    local_20 = (double)((lVar3 - (this->m_timer).m_nanoseconds) / 1000) / 1000000.0;
    iVar2 = std::uncaught_exceptions();
    if (iVar2 < 1) {
      pIVar4 = getResultCapture();
      lVar3 = 0x18;
    }
    else {
      pIVar4 = getResultCapture();
      lVar3 = 0x20;
    }
    (**(code **)((long)pIVar4->_vptr_IResultCapture + lVar3))(pIVar4,local_88);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0],local_58[0] + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar5 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_info).description._M_dataplus._M_p;
  paVar5 = &(this->m_info).description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->m_info).name._M_dataplus._M_p;
  paVar5 = &(this->m_info).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar5) {
    operator_delete(pcVar1,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Section::~Section() {
        if( m_sectionIncluded ) {
            SectionEndInfo endInfo{ m_info, m_assertions, m_timer.getElapsedSeconds() };
            if( uncaught_exceptions() )
                getResultCapture().sectionEndedEarly( endInfo );
            else
                getResultCapture().sectionEnded( endInfo );
        }
    }